

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  test_var_type tVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  size_type *psVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  long *local_350;
  long local_348;
  long local_340;
  long lStack_338;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  long local_2f0;
  InteractionUniformBuffers3<glcts::ArraysOfArrays::Interface::GL> *local_2e8;
  ulong local_2e0;
  long *plStack_2d8;
  long lStack_2d0;
  long lStack_2c8;
  long lStack_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2b8;
  string array_initializers [4];
  string invalid_size_declarations [15];
  
  invalid_size_declarations[0]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0].field_2;
  local_2e8 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)invalid_size_declarations,"[2][2][2][]","");
  invalid_size_declarations[1]._M_dataplus._M_p = (pointer)&invalid_size_declarations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 1),"[2][2][][2]","");
  invalid_size_declarations[2]._M_dataplus._M_p = (pointer)&invalid_size_declarations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 2),"[2][][2][2]","");
  invalid_size_declarations[3]._M_dataplus._M_p = (pointer)&invalid_size_declarations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 3),"[][2][2][2]","");
  invalid_size_declarations[4]._M_dataplus._M_p = (pointer)&invalid_size_declarations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 4),"[2][2][][]","");
  invalid_size_declarations[5]._M_dataplus._M_p = (pointer)&invalid_size_declarations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 5),"[2][][2][]","");
  invalid_size_declarations[6]._M_dataplus._M_p = (pointer)&invalid_size_declarations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 6),"[][2][2][]","");
  invalid_size_declarations[7]._M_dataplus._M_p = (pointer)&invalid_size_declarations[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 7),"[2][][][2]","");
  invalid_size_declarations[8]._M_dataplus._M_p = (pointer)&invalid_size_declarations[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 8),"[][2][][2]","");
  invalid_size_declarations[9]._M_dataplus._M_p = (pointer)&invalid_size_declarations[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 9),"[][][2][2]","");
  invalid_size_declarations[10]._M_dataplus._M_p = (pointer)&invalid_size_declarations[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 10),"[2][][][]","");
  invalid_size_declarations[0xb]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xb].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xb),"[][2][][]","");
  invalid_size_declarations[0xc]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xc].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xc),"[][][2][]","");
  invalid_size_declarations[0xd]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xd].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xd),"[][][][2]","");
  invalid_size_declarations[0xe]._M_dataplus._M_p = (pointer)&invalid_size_declarations[0xe].field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(invalid_size_declarations + 0xe),"[][][][]","");
  array_initializers[0]._M_dataplus._M_p = (pointer)&array_initializers[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)array_initializers,
             "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),float[2](3.0, 4.0)),float[2][2](float[2](5.0, 6.0),float[2](7.0, 8.0))),float[2][2][2](float[2][2](float[2](1.1, 2.1),float[2](3.1, 4.1)),float[2][2](float[2](5.1, 6.1),float[2](7.1, 8.1))));\n"
             ,"");
  array_initializers[1]._M_dataplus._M_p = (pointer)&array_initializers[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 1),
             "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),int[2]( 3,  4)),int[2][2](int[2]( 5,  6),int[2]( 7,  8))),int[2][2][2](int[2][2](int[2](11, 12),int[2](13, 14)),int[2][2](int[2](15, 16),int[2](17, 18))));\n"
             ,"");
  array_initializers[2]._M_dataplus._M_p = (pointer)&array_initializers[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 2),
             "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),uint[2]( 3u,  4u)),uint[2][2](uint[2]( 5u,  6u),uint[2]( 7u,  8u))),uint[2][2][2](uint[2][2](uint[2](11u, 12u),uint[2](13u, 14u)),uint[2][2](uint[2](15u, 16u),uint[2](17u, 18u))));\n"
             ,"");
  array_initializers[3]._M_dataplus._M_p = (pointer)&array_initializers[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(array_initializers + 3),
             "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),double[2](3.0, 4.0)),double[2][2](double[2](5.0, 6.0),double[2](7.0, 8.0))),double[2][2][2](double[2][2](double[2](1.1, 2.1),double[2](3.1, 4.1)),double[2][2](double[2](5.1, 6.1),double[2](7.1, 8.1))));\n"
             ,"");
  lVar7 = 0;
  while (supported_variable_types_map._16_8_ != 0) {
    tVar1 = test_shader_compilation::var_types_set_gl[lVar7];
    lVar8 = 0x21f1cb8;
    lVar9 = supported_variable_types_map._16_8_;
    do {
      if ((int)tVar1 <= *(int *)(lVar9 + 0x20)) {
        lVar8 = lVar9;
      }
      lVar9 = *(long *)(lVar9 + 0x10 + (ulong)(*(int *)(lVar9 + 0x20) < (int)tVar1) * 8);
    } while (lVar9 != 0);
    if ((lVar8 == 0x21f1cb8) || ((int)tVar1 < *(int *)(lVar8 + 0x20))) break;
    lVar9 = 8;
    local_2f0 = lVar7;
    do {
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
      shader_source._M_string_length = 0;
      shader_source.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_replace((ulong)&shader_source,0,(char *)0x0,0x1ade9aa);
      std::operator+(&local_310,"    ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lVar8 + 0x28));
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_310,
                                  *(ulong *)((long)&array_initializers[3].field_2 + lVar9 + 8));
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      psVar5 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_370.field_2._M_allocated_capacity = *psVar5;
        local_370.field_2._8_8_ = plVar2[3];
      }
      else {
        local_370.field_2._M_allocated_capacity = *psVar5;
        local_370._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_370._M_string_length = plVar2[1];
      *plVar2 = (long)psVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_370);
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_340 = *plVar6;
        lStack_338 = plVar2[3];
        local_350 = &local_340;
      }
      else {
        local_340 = *plVar6;
        local_350 = (long *)*plVar2;
      }
      local_348 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_350);
      if (local_350 != &local_340) {
        operator_delete(local_350,local_340 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&shader_source);
      std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x1c49);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_2e0 = (ulong)tested_shader_type;
      puVar3 = &set_tesseation_abi_cxx11_;
      switch(local_2e0) {
      case 1:
        std::__cxx11::string::append((char *)&shader_source);
        break;
      case 3:
        puVar3 = &emit_quad_abi_cxx11_;
      case 4:
        std::__cxx11::string::_M_append((char *)&shader_source,*puVar3);
      }
      std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
      if (lVar9 == 0x68) {
        (*(code *)(&DAT_01ad414c + *(int *)(&DAT_01ad414c + local_2e0 * 4)))
                  (&DAT_01ad414c + *(int *)(&DAT_01ad414c + local_2e0 * 4),empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
                   empty_string_abi_cxx11_);
        return;
      }
      (*(local_2e8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(local_2e8,(ulong)tested_shader_type,&shader_source);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x1e8);
    lVar7 = local_2f0 + 1;
    if (lVar7 == 4) {
      if (supported_variable_types_map._16_8_ != 0) {
        lVar9 = 0x21f1cb8;
        lVar7 = supported_variable_types_map._16_8_;
        do {
          if ((int)TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES <
              *(int *)(lVar7 + 0x20)) {
            lVar9 = lVar7;
          }
          lVar7 = *(long *)(lVar7 + 0x10 +
                           (ulong)(*(int *)(lVar7 + 0x20) <
                                  (int)TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT) * 8);
        } while (lVar7 != 0);
        if ((lVar9 != 0x21f1cb8) &&
           (*(int *)(lVar9 + 0x20) <
            (int)TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE)) {
          local_2f0 = 0;
          shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
          shader_source._M_string_length = 0;
          shader_source.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_replace((ulong)&shader_source,0,(char *)0x0,0x1ade9aa);
          std::operator+(&bStack_2b8,"    ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar9 + 0x28));
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&bStack_2b8,
                                      (ulong)invalid_size_declarations[0]._M_dataplus._M_p);
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_310.field_2._M_allocated_capacity = *psVar5;
            local_310.field_2._8_8_ = plVar2[3];
          }
          else {
            local_310.field_2._M_allocated_capacity = *psVar5;
            local_310._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_310._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
          local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
          psVar5 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_370.field_2._M_allocated_capacity = *psVar5;
            local_370.field_2._8_8_ = plVar2[3];
          }
          else {
            local_370.field_2._M_allocated_capacity = *psVar5;
            local_370._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_370._M_string_length = plVar2[1];
          *plVar2 = (long)psVar5;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_370,
                                      (ulong)array_initializers[0]._M_dataplus._M_p);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_340 = *plVar6;
            lStack_338 = plVar2[3];
            local_350 = &local_340;
          }
          else {
            local_340 = *plVar6;
            local_350 = (long *)*plVar2;
          }
          local_348 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_350);
          if (local_350 != &local_340) {
            operator_delete(local_350,local_340 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)bStack_2b8._M_dataplus._M_p != &bStack_2b8.field_2) {
            operator_delete(bStack_2b8._M_dataplus._M_p,bStack_2b8.field_2._M_allocated_capacity + 1
                           );
          }
          std::operator+(&local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar9 + 0x28),invalid_size_declarations);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_370);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            local_340 = *plVar6;
            lStack_338 = plVar2[3];
            local_350 = &local_340;
          }
          else {
            local_340 = *plVar6;
            local_350 = (long *)*plVar2;
          }
          local_348 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_350,
                                      (ulong)array_initializers[0]._M_dataplus._M_p);
          plVar6 = plVar2 + 2;
          if ((long *)*plVar2 == plVar6) {
            lStack_2c8 = *plVar6;
            lStack_2c0 = plVar2[3];
            plStack_2d8 = &lStack_2c8;
          }
          else {
            lStack_2c8 = *plVar6;
            plStack_2d8 = (long *)*plVar2;
          }
          lStack_2d0 = plVar2[1];
          *plVar2 = (long)plVar6;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          if (plStack_2d8 != &lStack_2c8) {
            operator_delete(plStack_2d8,lStack_2c8 + 1);
          }
          if (local_350 != &local_340) {
            operator_delete(local_350,local_340 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&shader_source);
          std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
          if (tested_shader_type < SHADER_TYPE_LAST) {
            (*(code *)(&DAT_01ad4164 + *(int *)(&DAT_01ad4164 + local_2e0 * 4)))();
            return;
          }
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1c72);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1c7a);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x1c52);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InteractionUniformBuffers3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_FLOAT, VAR_TYPE_INT, VAR_TYPE_UINT,
															 VAR_TYPE_DOUBLE };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string invalid_size_declarations[] = { "[2][2][2][]", "[2][2][][2]", "[2][][2][2]", "[][2][2][2]",
													  "[2][2][][]",  "[2][][2][]",  "[][2][2][]",  "[2][][][2]",
													  "[][2][][2]",  "[][][2][2]",  "[2][][][]",   "[][2][][]",
													  "[][][2][]",   "[][][][2]",   "[][][][]" };

	const std::string array_initializers[] = { "float[2][2][2][2](float[2][2][2](float[2][2](float[2](1.0, 2.0),"
											   "float[2](3.0, 4.0)),"
											   "float[2][2](float[2](5.0, 6.0),"
											   "float[2](7.0, 8.0))),"
											   "float[2][2][2](float[2][2](float[2](1.1, 2.1),"
											   "float[2](3.1, 4.1)),"
											   "float[2][2](float[2](5.1, 6.1),"
											   "float[2](7.1, 8.1))));\n",

											   "int[2][2][2][2](int[2][2][2](int[2][2](int[2]( 1,  2),"
											   "int[2]( 3,  4)),"
											   "int[2][2](int[2]( 5,  6),"
											   "int[2]( 7,  8))),"
											   "int[2][2][2](int[2][2](int[2](11, 12),"
											   "int[2](13, 14)),"
											   "int[2][2](int[2](15, 16),"
											   "int[2](17, 18))));\n",

											   "uint[2][2][2][2](uint[2][2][2](uint[2][2](uint[2]( 1u,  2u),"
											   "uint[2]( 3u,  4u)),"
											   "uint[2][2](uint[2]( 5u,  6u),"
											   "uint[2]( 7u,  8u))),"
											   "uint[2][2][2](uint[2][2](uint[2](11u, 12u),"
											   "uint[2](13u, 14u)),"
											   "uint[2][2](uint[2](15u, 16u),"
											   "uint[2](17u, 18u))));\n",

											   "double[2][2][2][2](double[2][2][2](double[2][2](double[2](1.0, 2.0),"
											   "double[2](3.0, 4.0)),"
											   "double[2][2](double[2](5.0, 6.0),"
											   "double[2](7.0, 8.0))),"
											   "double[2][2][2](double[2][2](double[2](1.1, 2.1),"
											   "double[2](3.1, 4.1)),"
											   "double[2][2](double[2](5.1, 6.1),"
											   "double[2](7.1, 8.1))));\n" };
	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	/* Iterate through float/ int/ uint types.
	 * Case: without initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] + " my_variable;\n";
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION && invalid_size_declarations_index == 3,
									tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */

	/* Iterate through float/ int/ uint types.
	 * Case: with initializer.
	 */
	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			for (size_t invalid_size_declarations_index = 0;
				 invalid_size_declarations_index <
				 sizeof(invalid_size_declarations) / sizeof(invalid_size_declarations[0]);
				 invalid_size_declarations_index++)
			{
				std::string shader_source;

				shader_source = "layout (std140) uniform MyUniform {\n";
				shader_source += "    " + var_iterator->second.type +
								 invalid_size_declarations[invalid_size_declarations_index] +
								 " my_variable = " + array_initializers[var_type_index];

				var_iterator->second.type + invalid_size_declarations[invalid_size_declarations_index] +
					" my_variable = " + array_initializers[var_type_index];
				shader_source += "};\n\n";
				shader_source += shader_start;

				/* End main */
				DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

				/* Execute test */
				this->execute_negative_test(tested_shader_type, shader_source);
			} /* for (int invalid_size_declarations_index = 0; ...) */
		}	 /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}